

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O2

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uchar *puVar10;
  char chksum [4];
  ogg_page log;
  
  if (-1 < oy->storage) {
    puVar10 = oy->data;
    piVar1 = (int *)(puVar10 + oy->returned);
    lVar9 = (long)oy->fill - (long)oy->returned;
    uVar5 = oy->headerbytes;
    uVar8 = (uint)lVar9;
    if (uVar5 == 0) {
      if ((int)uVar8 < 0x1b) {
        return 0;
      }
      if (*piVar1 != 0x5367674f) goto LAB_001c50f5;
      bVar2 = *(byte *)((long)piVar1 + 0x1a);
      uVar5 = bVar2 + 0x1b;
      if (uVar8 < uVar5) {
        return 0;
      }
      for (uVar7 = 0; uVar7 < bVar2; uVar7 = uVar7 + 1) {
        oy->bodybytes = oy->bodybytes + (uint)*(byte *)((long)piVar1 + uVar7 + 0x1b);
        bVar2 = *(byte *)((long)piVar1 + 0x1a);
      }
      oy->headerbytes = uVar5;
    }
    if ((int)(uVar5 + oy->bodybytes) <= (int)uVar8) {
      iVar4 = *(int *)((long)piVar1 + 0x16);
      *(undefined4 *)((long)piVar1 + 0x16) = 0;
      log.header_len = (long)oy->headerbytes;
      log.body = (uchar *)(log.header_len + (long)piVar1);
      log.body_len = (long)oy->bodybytes;
      log.header = (uchar *)piVar1;
      ogg_page_checksum_set(&log);
      if (iVar4 == *(int *)((long)piVar1 + 0x16)) {
        iVar4 = oy->headerbytes;
        iVar3 = oy->bodybytes;
        if (og != (ogg_page *)0x0) {
          og->header = (uchar *)piVar1;
          og->header_len = (long)iVar4;
          og->body = (uchar *)((long)piVar1 + (long)iVar4);
          og->body_len = (long)iVar3;
        }
        oy->unsynced = 0;
        oy->headerbytes = 0;
        iVar4 = iVar4 + iVar3;
        oy->returned = oy->returned + iVar4;
        oy->bodybytes = 0;
        return (long)iVar4;
      }
      *(int *)((long)piVar1 + 0x16) = iVar4;
      puVar10 = oy->data;
LAB_001c50f5:
      oy->headerbytes = 0;
      oy->bodybytes = 0;
      puVar6 = (uchar *)memchr((void *)((long)piVar1 + 1),0x4f,lVar9 - 1);
      if (puVar6 == (uchar *)0x0) {
        puVar6 = puVar10 + oy->fill;
      }
      oy->returned = (int)puVar6 - (int)puVar10;
      return (long)piVar1 - (long)puVar6;
    }
  }
  return 0;
}

Assistant:

long ogg_sync_pageseek(ogg_sync_state *oy,ogg_page *og){
  unsigned char *page=oy->data+oy->returned;
  unsigned char *next;
  long bytes=oy->fill-oy->returned;

  if(ogg_sync_check(oy))return 0;

  if(oy->headerbytes==0){
    int headerbytes,i;
    if(bytes<27)return(0); /* not enough for a header */

    /* verify capture pattern */
    if(memcmp(page,"OggS",4))goto sync_fail;

    headerbytes=page[26]+27;
    if(bytes<headerbytes)return(0); /* not enough for header + seg table */

    /* count up body length in the segment table */

    for(i=0;i<page[26];i++)
      oy->bodybytes+=page[27+i];
    oy->headerbytes=headerbytes;
  }

  if(oy->bodybytes+oy->headerbytes>bytes)return(0);

  /* The whole test page is buffered.  Verify the checksum */
  {
    /* Grab the checksum bytes, set the header field to zero */
    char chksum[4];
    ogg_page log;

    memcpy(chksum,page+22,4);
    memset(page+22,0,4);

    /* set up a temp page struct and recompute the checksum */
    log.header=page;
    log.header_len=oy->headerbytes;
    log.body=page+oy->headerbytes;
    log.body_len=oy->bodybytes;
    ogg_page_checksum_set(&log);

    /* Compare */
    if(memcmp(chksum,page+22,4)){
      /* D'oh.  Mismatch! Corrupt page (or miscapture and not a page
         at all) */
      /* replace the computed checksum with the one actually read in */
      memcpy(page+22,chksum,4);

#ifndef DISABLE_CRC
      /* Bad checksum. Lose sync */
      goto sync_fail;
#endif
    }
  }

  /* yes, have a whole page all ready to go */
  {
    if(og){
      og->header=page;
      og->header_len=oy->headerbytes;
      og->body=page+oy->headerbytes;
      og->body_len=oy->bodybytes;
    }

    oy->unsynced=0;
    oy->returned+=(bytes=oy->headerbytes+oy->bodybytes);
    oy->headerbytes=0;
    oy->bodybytes=0;
    return(bytes);
  }

 sync_fail:

  oy->headerbytes=0;
  oy->bodybytes=0;

  /* search for possible capture */
  next=memchr(page+1,'O',bytes-1);
  if(!next)
    next=oy->data+oy->fill;

  oy->returned=(int)(next-oy->data);
  return((long)-(next-page));
}